

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int zeroJournalHdr(Pager *pPager,int doTruncate)

{
  long lVar1;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  i64 iLimit;
  int rc;
  i64 sz;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  void *pBuf;
  int iVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = 0;
  if (*(long *)(in_RDI + 0x60) != 0) {
    pBuf = *(void **)(in_RDI + 0xd0);
    if ((in_ESI == 0) && (pBuf != (void *)0x0)) {
      iVar2 = sqlite3OsWrite((sqlite3_file *)0x0,pBuf,in_stack_ffffffffffffffd4,
                             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    else {
      iVar2 = sqlite3OsTruncate((sqlite3_file *)
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    if ((iVar2 == 0) && (*(char *)(in_RDI + 0xb) == '\0')) {
      iVar2 = sqlite3OsSync((sqlite3_file *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffcc);
    }
    if ((((iVar2 == 0) && (0 < (long)pBuf)) &&
        (iVar2 = sqlite3OsFileSize((sqlite3_file *)
                                   CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                   (i64 *)CONCAT44(in_stack_ffffffffffffffcc,
                                                   in_stack_ffffffffffffffc8)), iVar2 == 0)) &&
       ((long)pBuf < -0x5555555555555556)) {
      iVar2 = sqlite3OsTruncate((sqlite3_file *)
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int zeroJournalHdr(Pager *pPager, int doTruncate){
  int rc = SQLITE_OK;                               /* Return code */
  assert( isOpen(pPager->jfd) );
  assert( !sqlite3JournalIsInMemory(pPager->jfd) );
  if( pPager->journalOff ){
    const i64 iLimit = pPager->journalSizeLimit;    /* Local cache of jsl */

    IOTRACE(("JZEROHDR %p\n", pPager))
    if( doTruncate || iLimit==0 ){
      rc = sqlite3OsTruncate(pPager->jfd, 0);
    }else{
      static const char zeroHdr[28] = {0};
      rc = sqlite3OsWrite(pPager->jfd, zeroHdr, sizeof(zeroHdr), 0);
    }
    if( rc==SQLITE_OK && !pPager->noSync ){
      rc = sqlite3OsSync(pPager->jfd, SQLITE_SYNC_DATAONLY|pPager->syncFlags);
    }

    /* At this point the transaction is committed but the write lock
    ** is still held on the file. If there is a size limit configured for
    ** the persistent journal and the journal file currently consumes more
    ** space than that limit allows for, truncate it now. There is no need
    ** to sync the file following this operation.
    */
    if( rc==SQLITE_OK && iLimit>0 ){
      i64 sz;
      rc = sqlite3OsFileSize(pPager->jfd, &sz);
      if( rc==SQLITE_OK && sz>iLimit ){
        rc = sqlite3OsTruncate(pPager->jfd, iLimit);
      }
    }
  }
  return rc;
}